

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mv_generic.h
# Opt level: O0

void m2v_permute_rows(m2v *M,int *rowperm)

{
  int n_col;
  long lVar1;
  uint uVar2;
  long lVar3;
  undefined8 uStack_70;
  undefined8 local_68;
  undefined8 uStack_60;
  int local_58;
  int e_next;
  int e;
  int i_1;
  m2v rowbuf_mat;
  unsigned_long __vla_expr1;
  int i;
  unsigned_long __vla_expr0;
  int *rowperm_local;
  m2v *M_local;
  
  lVar1 = -((ulong)(uint)M->n_row + 0xf & 0xfffffffffffffff0);
  lVar3 = (long)&local_68 + lVar1;
  for (__vla_expr1._4_4_ = 0; __vla_expr1._4_4_ < M->n_row;
      __vla_expr1._4_4_ = __vla_expr1._4_4_ + 1) {
    *(undefined1 *)(lVar3 + __vla_expr1._4_4_) = 0;
  }
  n_col = M->n_col;
  local_68 = lVar3;
  *(undefined8 *)((long)&uStack_70 + lVar1) = 0x10409e;
  uVar2 = m2v_get_row_size(n_col);
  lVar3 = lVar3 - ((long)(ulong)uVar2 * 4 + 0xfU & 0xfffffffffffffff0);
  rowbuf_mat.e = (m2v_base *)(ulong)uVar2;
  *(undefined8 *)(lVar3 + -8) = 0x1040ce;
  m2v_make(*(int *)(lVar3 + 0x1c),*(int *)(lVar3 + 0x18),*(m2v_base **)(lVar3 + 0x10));
  for (e_next = 0; e_next < M->n_row; e_next = e_next + 1) {
    if (*(char *)(local_68 + e_next) == '\0') {
      if (rowperm[e_next] == e_next) {
        *(undefined1 *)(local_68 + e_next) = 1;
      }
      else {
        *(undefined8 *)(lVar3 + -8) = 0x10412a;
        m2v_copy_row(*(m2v **)(lVar3 + 0x18),*(int *)(lVar3 + 0x14),*(m2v **)(lVar3 + 8),
                     *(int *)(lVar3 + 4));
        local_58 = e_next;
        for (uStack_60._4_4_ = rowperm[e_next]; uStack_60._4_4_ != e_next;
            uStack_60._4_4_ = rowperm[uStack_60._4_4_]) {
          *(undefined1 *)(local_68 + uStack_60._4_4_) = 1;
          *(undefined8 *)(lVar3 + -8) = 0x104165;
          m2v_copy_row(*(m2v **)(lVar3 + 0x18),*(int *)(lVar3 + 0x14),*(m2v **)(lVar3 + 8),
                       *(int *)(lVar3 + 4));
          local_58 = uStack_60._4_4_;
        }
        *(undefined1 *)(local_68 + e_next) = 1;
        *(undefined8 *)(lVar3 + -8) = 0x104199;
        m2v_copy_row(*(m2v **)(lVar3 + 0x18),*(int *)(lVar3 + 0x14),*(m2v **)(lVar3 + 8),
                     *(int *)(lVar3 + 4));
      }
    }
  }
  return;
}

Assistant:

void MV_GEN_N(_permute_rows)(MV_GEN_TYPE* M, const int* rowperm)
{
	char visited[M->n_row];
	for (int i = 0; i < M->n_row; ++i)
		visited[i] = 0;

	MV_GEN_N(_Def)(rowbuf_mat, rowbuf, 1, M->n_col)
	for (int i = 0; i < M->n_row; ++i) {
		if (visited[i])
			continue;
		if (rowperm[i] == i) {
			/* Simple case of a self-cycle; do nothing. */
			visited[i] = 1;
			continue;
		}

		/* Otherwise we need to shuffle things around. */
		MV_GEN_N(_copy_row)(M, i, &rowbuf_mat, 0);
		int e = i, e_next = rowperm[i];
		while (e_next != i) {
			assert(!visited[e_next]);
			visited[e_next] = 1;
			MV_GEN_N(_copy_row)(M, e_next, M, e);

			/* Advance in the cycle */
			e = e_next;
			e_next = rowperm[e_next];
		}
		visited[i] = 1;
		MV_GEN_N(_copy_row)(&rowbuf_mat, 0, M, e);
	}
}